

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

bool flatbuffers::anon_unknown_0::compareFieldDefs(FieldDef *a,FieldDef *b)

{
  int iVar1;
  int iVar2;
  Value *pVVar3;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"id",&local_39);
  pVVar3 = SymbolTable<flatbuffers::Value>::Lookup(&(a->super_Definition).attributes,&local_38);
  iVar1 = atoi((pVVar3->constant)._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"id",&local_39);
  pVVar3 = SymbolTable<flatbuffers::Value>::Lookup(&(b->super_Definition).attributes,&local_38);
  iVar2 = atoi((pVVar3->constant)._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar1 < iVar2;
}

Assistant:

static bool compareFieldDefs(const FieldDef *a, const FieldDef *b) {
  auto a_id = atoi(a->attributes.Lookup("id")->constant.c_str());
  auto b_id = atoi(b->attributes.Lookup("id")->constant.c_str());
  return a_id < b_id;
}